

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_14::FieldValuePrinterWrapper::PrintInt32
          (FieldValuePrinterWrapper *this,int32_t val,BaseTextGenerator *generator)

{
  FieldValuePrinter *pFVar1;
  long *local_30;
  undefined8 local_28;
  long local_20 [2];
  
  pFVar1 = (this->delegate_)._M_t.
           super___uniq_ptr_impl<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           .super__Head_base<0UL,_const_google::protobuf::TextFormat::FieldValuePrinter_*,_false>.
           _M_head_impl;
  (*pFVar1->_vptr_FieldValuePrinter[3])(&local_30,pFVar1,val);
  (*generator->_vptr_BaseTextGenerator[5])(generator,local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return;
}

Assistant:

void PrintInt32(int32_t val,
                  TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintString(delegate_->PrintInt32(val));
  }